

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_event_trigger.c
# Opt level: O0

int event_timed_wait(event_ctx_impl *ctx,uint milli_sec)

{
  long microdelay;
  timeval curr_time;
  timespec final_time;
  int err;
  uint milli_sec_local;
  event_ctx_impl *ctx_local;
  
  final_time.tv_nsec._0_4_ = 0;
  gettimeofday((timeval *)&microdelay,(__timezone_ptr_t)0x0);
  curr_time.tv_usec = microdelay + (long)((ulong)(milli_sec * 1000) + curr_time.tv_sec) / 1000000;
  pthread_mutex_lock((pthread_mutex_t *)&ctx->mutex);
  while (ctx->semval != 0) {
    final_time.tv_nsec._0_4_ =
         pthread_cond_timedwait
                   ((pthread_cond_t *)&ctx->condition,(pthread_mutex_t *)&ctx->mutex,
                    (timespec *)&curr_time.tv_usec);
    if ((int)final_time.tv_nsec != 0) {
      ctx->semval = ctx->semval - 1;
    }
  }
  ctx->semval = ctx->semval - 1;
  pthread_mutex_unlock((pthread_mutex_t *)&ctx->mutex);
  return (int)final_time.tv_nsec;
}

Assistant:

static int event_timed_wait(struct event_ctx_impl *ctx, unsigned int milli_sec)
{
    int err = 0;
    struct timespec final_time;
    struct timeval curr_time;
    long int microdelay;

    gettimeofday(&curr_time, NULL);
    /*
     * convert timeval to timespec and add delay in milliseconds
     * for the timeout
     */
    microdelay = ((milli_sec * 1000 + curr_time.tv_usec));
    final_time.tv_sec = curr_time.tv_sec + (microdelay / 1000000);
    final_time.tv_nsec = (microdelay % 1000000) * 1000;
    pthread_mutex_lock(&ctx->mutex);
    while (ctx->semval > 0) {
        err = pthread_cond_timedwait(&ctx->condition, &ctx->mutex, &final_time);
        if (err != 0)
            ctx->semval--;
    }
    ctx->semval--;
    pthread_mutex_unlock(&ctx->mutex);
    return err;
}